

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O2

TestCase * __thiscall
iutest::UnitTestImpl::AddTestCase<iutest::TypedTestCase<char32_t>>
          (UnitTestImpl *this,char *testcase_name,TestTypeId id,SetUpMethod setup,
          TearDownMethod teardown)

{
  TypedTestCase<char32_t> *this_00;
  
  this_00 = (TypedTestCase<char32_t> *)FindTestCase(this,testcase_name,id);
  if (this_00 == (TypedTestCase<char32_t> *)0x0) {
    this_00 = (TypedTestCase<char32_t> *)operator_new(0xd0);
    TypedTestCase<char32_t>::TypedTestCase(this_00,testcase_name,id,setup,teardown);
    detail::iu_list<iutest::TestCase>::push_back(&this->m_testcases,(node_ptr)this_00);
  }
  return &this_00->super_TestCase;
}

Assistant:

TestCase* AddTestCase(const char* testcase_name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown IUTEST_APPEND_EXPLICIT_TEMPLATE_TYPE_(T) )
    {
        TestCase* p = FindTestCase(testcase_name, id);
        if( p == NULL )
        {
            p = new T (testcase_name, id, setup, teardown);
            m_testcases.push_back(p);
        }
        return p;
    }